

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluConfigFilter.cpp
# Opt level: O1

int __thiscall eglu::CandidateConfig::get(CandidateConfig *this,deUint32 attrib)

{
  deInt32 dVar1;
  EGLint EVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  if (this->m_type == TYPE_CONFIG_INFO) {
    dVar1 = ConfigInfo::getAttribute((this->m_cfg).configInfo,attrib);
    return dVar1;
  }
  if (attrib == 0x3339) {
    getDisplayExtensions_abi_cxx11_
              (&local_28,(eglu *)(this->m_cfg).object.egl,(Library *)(this->m_cfg).object.display,
               (EGLDisplay)(ulong)attrib);
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[27]>>
                      (local_28.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_28.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"EGL_EXT_pixel_format_float");
    if (_Var3._M_current ==
        local_28.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      EVar2 = 0x333a;
    }
    else {
      EVar2 = getConfigAttribInt((this->m_cfg).object.egl,(this->m_cfg).object.display,
                                 (this->m_cfg).object.config,0x3339);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_28);
    return EVar2;
  }
  EVar2 = getConfigAttribInt((this->m_cfg).object.egl,(this->m_cfg).object.display,
                             (this->m_cfg).object.config,attrib);
  return EVar2;
}

Assistant:

int CandidateConfig::get (deUint32 attrib) const
{
	if (m_type == TYPE_CONFIG_INFO)
		return m_cfg.configInfo->getAttribute(attrib);
	else
	{
		if (attrib == EGL_COLOR_COMPONENT_TYPE_EXT)
		{
			const std::vector<std::string>	extensions	= getDisplayExtensions(*m_cfg.object.egl, m_cfg.object.display);

			if (de::contains(extensions.begin(), extensions.end(), "EGL_EXT_pixel_format_float"))
				return getConfigAttribInt(*m_cfg.object.egl, m_cfg.object.display, m_cfg.object.config, attrib);
			else
				return EGL_COLOR_COMPONENT_TYPE_FIXED_EXT;
		}
		else
			return getConfigAttribInt(*m_cfg.object.egl, m_cfg.object.display, m_cfg.object.config, attrib);
	}
}